

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2polygon.cc
# Opt level: O1

void __thiscall
S2Polygon::S2Polygon
          (S2Polygon *this,unique_ptr<S2Loop,_std::default_delete<S2Loop>_> *loop,S2Debug override)

{
  _Head_base<0UL,_S2Loop_*,_false> _Var1;
  _Head_base<0UL,_S2Loop_*,_false> local_20;
  
  (this->super_S2Region)._vptr_S2Region = (_func_int **)&PTR__S2Polygon_002c2b58;
  (this->loops_).
  super__Vector_base<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>,_std::allocator<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->loops_).
  super__Vector_base<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>,_std::allocator<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->loops_).
  super__Vector_base<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>,_std::allocator<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->s2debug_override_ = override;
  (this->bound_).super_S2Region._vptr_S2Region = (_func_int **)&PTR__S2Region_002c2078;
  (this->bound_).lat_.bounds_.c_[0] = 1.0;
  (this->bound_).lat_.bounds_.c_[1] = 0.0;
  (this->bound_).lng_.bounds_.c_[0] = 3.141592653589793;
  (this->bound_).lng_.bounds_.c_[1] = -3.141592653589793;
  (this->subregion_bound_).super_S2Region._vptr_S2Region = (_func_int **)&PTR__S2Region_002c2078;
  (this->subregion_bound_).lat_.bounds_.c_[0] = 1.0;
  (this->subregion_bound_).lat_.bounds_.c_[1] = 0.0;
  (this->subregion_bound_).lng_.bounds_.c_[0] = 3.141592653589793;
  (this->subregion_bound_).lng_.bounds_.c_[1] = -3.141592653589793;
  MutableS2ShapeIndex::MutableS2ShapeIndex(&this->index_);
  local_20._M_head_impl =
       (loop->_M_t).super___uniq_ptr_impl<S2Loop,_std::default_delete<S2Loop>_>._M_t.
       super__Tuple_impl<0UL,_S2Loop_*,_std::default_delete<S2Loop>_>.
       super__Head_base<0UL,_S2Loop_*,_false>._M_head_impl;
  (loop->_M_t).super___uniq_ptr_impl<S2Loop,_std::default_delete<S2Loop>_>._M_t.
  super__Tuple_impl<0UL,_S2Loop_*,_std::default_delete<S2Loop>_>.
  super__Head_base<0UL,_S2Loop_*,_false>._M_head_impl = (S2Loop *)0x0;
  Init(this,(unique_ptr<S2Loop,_std::default_delete<S2Loop>_> *)&local_20);
  _Var1._M_head_impl = local_20._M_head_impl;
  if (local_20._M_head_impl != (S2Loop *)0x0) {
    S2Loop::~S2Loop(local_20._M_head_impl);
    operator_delete(_Var1._M_head_impl);
  }
  return;
}

Assistant:

S2Polygon::S2Polygon(unique_ptr<S2Loop> loop, S2Debug override)
    : s2debug_override_(override) {
  Init(std::move(loop));
}